

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecryptPDF.cpp
# Opt level: O0

int RecryptPDF(int argc,char **argv)

{
  char **ppcVar1;
  LogConfiguration *pLVar2;
  EncryptionOptions *pEVar3;
  allocator<char> local_821;
  string local_820;
  allocator<char> local_7f9;
  string local_7f8;
  EncryptionOptions local_7d8;
  PDFCreationSettings local_788;
  allocator<char> local_721;
  string local_720;
  string local_700;
  allocator<char> local_6d9;
  string local_6d8;
  allocator<char> local_6b1;
  string local_6b0;
  string local_690;
  allocator<char> local_669;
  string local_668;
  allocator<char> local_641;
  string local_640;
  EncryptionOptions local_620;
  PDFCreationSettings local_5d0;
  allocator<char> local_569;
  string local_568;
  string local_548;
  allocator<char> local_521;
  string local_520;
  allocator<char> local_4f9;
  string local_4f8;
  string local_4d8;
  allocator<char> local_4b1;
  string local_4b0;
  allocator<char> local_489;
  string local_488;
  EncryptionOptions local_468;
  PDFCreationSettings local_418;
  allocator<char> local_3b1;
  string local_3b0;
  string local_390;
  allocator<char> local_369;
  string local_368;
  allocator<char> local_341;
  string local_340;
  string local_320;
  EncryptionOptions local_300;
  PDFCreationSettings local_2b0;
  allocator<char> local_249;
  string local_248;
  string local_228;
  allocator<char> local_201;
  string local_200;
  allocator<char> local_1d9;
  string local_1d8;
  string local_1b8;
  EncryptionOptions local_198;
  PDFCreationSettings local_148;
  allocator<char> local_e1;
  string local_e0;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_61;
  string local_60;
  string local_40;
  EStatusCode local_1c;
  char **ppcStack_18;
  EStatusCode status;
  char **argv_local;
  int argc_local;
  
  ppcStack_18 = argv;
  argv_local._4_4_ = argc;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"china.pdf",&local_61);
  BuildRelativeInputPath(&local_40,argv,&local_60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"",&local_99);
  ppcVar1 = ppcStack_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"chinaWithoutEncryption.pdf",&local_e1);
  BuildRelativeOutputPath(&local_c0,ppcVar1,&local_e0);
  pLVar2 = LogConfiguration::DefaultLogConfiguration();
  pEVar3 = EncryptionOptions::DefaultEncryptionOptions();
  EncryptionOptions::EncryptionOptions(&local_198,pEVar3);
  PDFCreationSettings::PDFCreationSettings(&local_148,true,true,&local_198,false);
  local_1c = PDFWriter::RecryptPDF
                       (&local_40,&local_98,&local_c0,pLVar2,&local_148,ePDFVersionUndefined);
  PDFCreationSettings::~PDFCreationSettings(&local_148);
  EncryptionOptions::~EncryptionOptions(&local_198);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  ppcVar1 = ppcStack_18;
  if (local_1c == eSuccess) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d8,"PDFWithPassword.pdf",&local_1d9);
    BuildRelativeInputPath(&local_1b8,ppcVar1,&local_1d8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_200,"user",&local_201);
    ppcVar1 = ppcStack_18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_248,"RecryptPDFWithPasswordToNothing.pdf",&local_249);
    BuildRelativeOutputPath(&local_228,ppcVar1,&local_248);
    pLVar2 = LogConfiguration::DefaultLogConfiguration();
    pEVar3 = EncryptionOptions::DefaultEncryptionOptions();
    EncryptionOptions::EncryptionOptions(&local_300,pEVar3);
    PDFCreationSettings::PDFCreationSettings(&local_2b0,true,true,&local_300,false);
    local_1c = PDFWriter::RecryptPDF
                         (&local_1b8,&local_200,&local_228,pLVar2,&local_2b0,ePDFVersionUndefined);
    PDFCreationSettings::~PDFCreationSettings(&local_2b0);
    EncryptionOptions::~EncryptionOptions(&local_300);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_248);
    std::allocator<char>::~allocator(&local_249);
    std::__cxx11::string::~string((string *)&local_200);
    std::allocator<char>::~allocator(&local_201);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::allocator<char>::~allocator(&local_1d9);
    ppcVar1 = ppcStack_18;
    if (local_1c == eSuccess) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_340,"PDFWithPassword.pdf",&local_341);
      BuildRelativeInputPath(&local_320,ppcVar1,&local_340);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_368,"user",&local_369);
      ppcVar1 = ppcStack_18;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3b0,"RecryptPDFWithPasswordToNewPassword.pdf",&local_3b1);
      BuildRelativeOutputPath(&local_390,ppcVar1,&local_3b0);
      pLVar2 = LogConfiguration::DefaultLogConfiguration();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_488,"user1",&local_489);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_4b0,"owner1",&local_4b1);
      EncryptionOptions::EncryptionOptions(&local_468,&local_488,4,&local_4b0);
      PDFCreationSettings::PDFCreationSettings(&local_418,true,true,&local_468,false);
      local_1c = PDFWriter::RecryptPDF
                           (&local_320,&local_368,&local_390,pLVar2,&local_418,ePDFVersionUndefined)
      ;
      PDFCreationSettings::~PDFCreationSettings(&local_418);
      EncryptionOptions::~EncryptionOptions(&local_468);
      std::__cxx11::string::~string((string *)&local_4b0);
      std::allocator<char>::~allocator(&local_4b1);
      std::__cxx11::string::~string((string *)&local_488);
      std::allocator<char>::~allocator(&local_489);
      std::__cxx11::string::~string((string *)&local_390);
      std::__cxx11::string::~string((string *)&local_3b0);
      std::allocator<char>::~allocator(&local_3b1);
      std::__cxx11::string::~string((string *)&local_368);
      std::allocator<char>::~allocator(&local_369);
      std::__cxx11::string::~string((string *)&local_320);
      std::__cxx11::string::~string((string *)&local_340);
      std::allocator<char>::~allocator(&local_341);
      ppcVar1 = ppcStack_18;
      if (local_1c == eSuccess) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_4f8,"Original.pdf",&local_4f9);
        BuildRelativeInputPath(&local_4d8,ppcVar1,&local_4f8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_520,"",&local_521);
        ppcVar1 = ppcStack_18;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_568,"RecryptPDFOriginalToPasswordProtected.pdf",&local_569);
        BuildRelativeOutputPath(&local_548,ppcVar1,&local_568);
        pLVar2 = LogConfiguration::DefaultLogConfiguration();
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_640,"user1",&local_641);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_668,"owner1",&local_669)
        ;
        EncryptionOptions::EncryptionOptions(&local_620,&local_640,4,&local_668);
        PDFCreationSettings::PDFCreationSettings(&local_5d0,true,true,&local_620,false);
        local_1c = PDFWriter::RecryptPDF
                             (&local_4d8,&local_520,&local_548,pLVar2,&local_5d0,
                              ePDFVersionUndefined);
        PDFCreationSettings::~PDFCreationSettings(&local_5d0);
        EncryptionOptions::~EncryptionOptions(&local_620);
        std::__cxx11::string::~string((string *)&local_668);
        std::allocator<char>::~allocator(&local_669);
        std::__cxx11::string::~string((string *)&local_640);
        std::allocator<char>::~allocator(&local_641);
        std::__cxx11::string::~string((string *)&local_548);
        std::__cxx11::string::~string((string *)&local_568);
        std::allocator<char>::~allocator(&local_569);
        std::__cxx11::string::~string((string *)&local_520);
        std::allocator<char>::~allocator(&local_521);
        std::__cxx11::string::~string((string *)&local_4d8);
        std::__cxx11::string::~string((string *)&local_4f8);
        std::allocator<char>::~allocator(&local_4f9);
        ppcVar1 = ppcStack_18;
        if (local_1c == eSuccess) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_6b0,"Original.pdf",&local_6b1);
          BuildRelativeInputPath(&local_690,ppcVar1,&local_6b0);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_6d8,"",&local_6d9);
          ppcVar1 = ppcStack_18;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_720,"RecryptPDFOriginalToPasswordProtectedAES.pdf",&local_721)
          ;
          BuildRelativeOutputPath(&local_700,ppcVar1,&local_720);
          pLVar2 = LogConfiguration::DefaultLogConfiguration();
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_7f8,"user1",&local_7f9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_820,"owner1",&local_821);
          EncryptionOptions::EncryptionOptions(&local_7d8,&local_7f8,4,&local_820);
          PDFCreationSettings::PDFCreationSettings(&local_788,true,true,&local_7d8,false);
          local_1c = PDFWriter::RecryptPDF
                               (&local_690,&local_6d8,&local_700,pLVar2,&local_788,ePDFVersion16);
          PDFCreationSettings::~PDFCreationSettings(&local_788);
          EncryptionOptions::~EncryptionOptions(&local_7d8);
          std::__cxx11::string::~string((string *)&local_820);
          std::allocator<char>::~allocator(&local_821);
          std::__cxx11::string::~string((string *)&local_7f8);
          std::allocator<char>::~allocator(&local_7f9);
          std::__cxx11::string::~string((string *)&local_700);
          std::__cxx11::string::~string((string *)&local_720);
          std::allocator<char>::~allocator(&local_721);
          std::__cxx11::string::~string((string *)&local_6d8);
          std::allocator<char>::~allocator(&local_6d9);
          std::__cxx11::string::~string((string *)&local_690);
          std::__cxx11::string::~string((string *)&local_6b0);
          std::allocator<char>::~allocator(&local_6b1);
          if (local_1c != eSuccess) {
            std::operator<<((ostream *)&std::cout,"failed to encrypt PDF with new password PDF\n");
          }
        }
        else {
          std::operator<<((ostream *)&std::cout,"failed to encrypt PDF with new password PDF\n");
        }
      }
      else {
        std::operator<<((ostream *)&std::cout,"failed to encrypt PDF with new password PDF\n");
      }
    }
    else {
      std::operator<<((ostream *)&std::cout,"failed to decrypt PDF\n");
    }
  }
  else {
    std::operator<<((ostream *)&std::cout,"failed to decrypt PDF\n");
  }
  return (uint)(local_1c != eSuccess);
}

Assistant:

int RecryptPDF(int argc, char* argv[])
{
	EStatusCode status; 

	do
	{
		// recrypt a document with AES encryption, and remove it
		status = PDFWriter::RecryptPDF(
			BuildRelativeInputPath(argv,"china.pdf"),
			"",
			BuildRelativeOutputPath(argv,"chinaWithoutEncryption.pdf"),
			LogConfiguration::DefaultLogConfiguration(),
			PDFCreationSettings(true, true));
		if (status != PDFHummus::eSuccess)
		{
			cout << "failed to decrypt PDF\n";
			break;
		}

		// recrypt an encrypted document with no password
		status = PDFWriter::RecryptPDF(
			BuildRelativeInputPath(argv,"PDFWithPassword.pdf"),
			"user",
			BuildRelativeOutputPath(argv,"RecryptPDFWithPasswordToNothing.pdf"),
			LogConfiguration::DefaultLogConfiguration(),
			PDFCreationSettings(true,true));
		if (status != PDFHummus::eSuccess)
		{
			cout << "failed to decrypt PDF\n";
			break;
		}

		// recrypt an encrypted document with new password
		status = PDFWriter::RecryptPDF(
			BuildRelativeInputPath(argv,"PDFWithPassword.pdf"),
			"user",
			BuildRelativeOutputPath(argv,"RecryptPDFWithPasswordToNewPassword.pdf"),
			LogConfiguration::DefaultLogConfiguration(),
			PDFCreationSettings(true,true,EncryptionOptions("user1",4,"owner1")));
		if (status != PDFHummus::eSuccess)
		{
			cout << "failed to encrypt PDF with new password PDF\n";
			break;
		}

		// recrypt a plain to document to one with password
		status = PDFWriter::RecryptPDF(
			BuildRelativeInputPath(argv,"Original.pdf"),
			"",
			BuildRelativeOutputPath(argv,"RecryptPDFOriginalToPasswordProtected.pdf"),
			LogConfiguration::DefaultLogConfiguration(),
			PDFCreationSettings(true, true, EncryptionOptions("user1", 4, "owner1")));
		if (status != PDFHummus::eSuccess)
		{
			cout << "failed to encrypt PDF with new password PDF\n";
			break;
		}

		// same, but forcing AES
		status = PDFWriter::RecryptPDF(
			BuildRelativeInputPath(argv,"Original.pdf"),
			"",
			BuildRelativeOutputPath(argv,"RecryptPDFOriginalToPasswordProtectedAES.pdf"),
			LogConfiguration::DefaultLogConfiguration(),
			PDFCreationSettings(true, true, EncryptionOptions("user1", 4, "owner1")),
			ePDFVersion16);
		if (status != PDFHummus::eSuccess)
		{
			cout << "failed to encrypt PDF with new password PDF\n";
			break;
		}

	}while(false);

	return status == eSuccess ? 0:1;	
}